

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileSort.cpp
# Opt level: O3

int sortTwoFiles(string *file1,string *file2)

{
  bool bVar1;
  bool bVar2;
  long *plVar3;
  ostream *poVar4;
  bool bVar5;
  bool bVar6;
  int fileValue2;
  int fileValue1;
  ofstream outFileStream;
  ifstream fileStream2;
  ifstream fileStream1;
  char local_649;
  int local_648;
  int local_644;
  long local_640 [4];
  byte abStack_620 [480];
  long local_440 [4];
  byte abStack_420 [488];
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238);
  std::ifstream::ifstream(local_440);
  std::ofstream::ofstream((ofstream *)local_640);
  std::ifstream::open((char *)local_238,(_Ios_Openmode)(file1->_M_dataplus)._M_p);
  std::ifstream::open((char *)local_440,(_Ios_Openmode)(file2->_M_dataplus)._M_p);
  std::ofstream::open((char *)local_640,(_Ios_Openmode)OUT_FILE_NAME);
  if ((((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) ||
      ((abStack_420[*(long *)(local_440[0] + -0x18)] & 5) != 0)) ||
     ((abStack_620[*(long *)(local_640[0] + -0x18)] & 5) != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ERROR!",6);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) goto LAB_00102592;
    goto LAB_00102544;
  }
  bVar5 = true;
  file2 = (string *)0x0;
  bVar6 = true;
  file1 = (string *)CONCAT71((int7)((ulong)file1 >> 8),1);
  bVar2 = true;
  do {
    if (((byte)file1 & bVar5) != 0) {
      plVar3 = (long *)std::istream::operator>>((istream *)local_238,&local_644);
      bVar5 = (*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) != 0;
      file1 = (string *)((ulong)file1 & 0xff);
      if (bVar5) {
        file1 = file2;
      }
    }
    if ((bool)(bVar2 & bVar6)) {
      plVar3 = (long *)std::istream::operator>>((istream *)local_440,&local_648);
      bVar6 = (*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) != 0;
      if (bVar6) {
        bVar2 = false;
      }
    }
    if (((ulong)file1 & 1) == 0) {
      if (bVar2) {
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_640,local_648);
        local_649 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_649,1);
        goto LAB_00102454;
      }
LAB_0010247b:
      bVar1 = false;
    }
    else {
      if (!bVar2) {
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_640,local_644);
        local_649 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_649,1);
        bVar5 = true;
        goto LAB_0010247b;
      }
      if (local_648 < local_644) {
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_640,local_648);
        local_649 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_649,1);
LAB_00102454:
        bVar1 = true;
        bVar6 = true;
      }
      else if (local_644 < local_648) {
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_640,local_644);
        local_649 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_649,1);
        bVar1 = true;
        bVar5 = true;
      }
      else {
        bVar1 = true;
        if (local_644 == local_648) {
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_640,local_644);
          local_649 = '\n';
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_649,1);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_648);
          local_649 = '\n';
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_649,1);
          bVar5 = true;
          goto LAB_00102454;
        }
      }
    }
    if ((!bVar1) && (((ulong)file1 & 1) == 0)) {
      do {
        std::ifstream::close();
        std::ifstream::close();
        std::ofstream::close();
LAB_00102592:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Unable to read from file: ",0x1a);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(file1->_M_dataplus)._M_p,file1->_M_string_length)
        ;
        std::endl<char,std::char_traits<char>>(poVar4);
LAB_00102544:
        if ((abStack_420[*(long *)(local_440[0] + -0x18)] & 5) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Unable to read from file: ",0x1a);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(file2->_M_dataplus)._M_p,
                              file2->_M_string_length);
          std::endl<char,std::char_traits<char>>(poVar4);
        }
        if ((abStack_620[*(long *)(local_640[0] + -0x18)] & 5) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Unable to write to file: ",0x19);
          poVar4 = std::operator<<((ostream *)&std::cout,OUT_FILE_NAME);
          std::endl<char,std::char_traits<char>>(poVar4);
        }
      } while( true );
    }
  } while( true );
}

Assistant:

int sortTwoFiles(std::string file1, std::string file2)
{
    std::ifstream fileStream1;
    std::ifstream fileStream2;
    std::ofstream outFileStream;

    //open files for reading and check to make sure we don't have any errors

    fileStream1.open(file1.c_str());
    fileStream2.open(file2.c_str());
    outFileStream.open(OUT_FILE_NAME);


    int fileValue1;
    int fileValue2;
    bool fileValue1Used = true;
    bool fileValue2Used = true;
    bool fileContinue1 = true;
    bool fileContinue2 = true;

    if(fileStream1 && fileStream2 && outFileStream)
    {
        //if we have gotten this far, we can read or write to all files
        do
        {
            //Populate our variables and see if we need to keep populating from a
            //given file
            if(fileContinue1 && fileValue1Used)
            {
                if (fileStream1 >> fileValue1)
                {
                    fileValue1Used = false;
                }
                else
                {
                    fileContinue1 = false;
                }
            }
            if(fileContinue2 && fileValue2Used)
            {
                if (fileStream2 >> fileValue2)
                {
                    fileValue2Used = false;
                }
                else
                {
                    fileContinue2 = false;

                }
            }

            //Now the logic to write out...

            if(!fileContinue1 && fileContinue2)
            {
                outFileStream << fileValue2 << '\n';
                fileValue2Used = true;


            }
            else if(fileContinue1 && !fileContinue2)
            {
                outFileStream << fileValue1 << '\n';
                fileValue1Used = true;
            }
            else if((fileValue1 > fileValue2) && (fileContinue1 && fileContinue2))
            {
                outFileStream << fileValue2 << '\n';
                fileValue2Used = true;
            }
            else if((fileValue1 < fileValue2) && (fileContinue1 && fileContinue2))
            {
                outFileStream << fileValue1 << '\n';
                fileValue1Used = true;
            }
            else if((fileValue1 == fileValue2) && (fileContinue1 && fileContinue2))
            {
                outFileStream << fileValue1 << '\n' << fileValue2 << '\n';
                fileValue1Used = true;
                fileValue2Used = true;
            }



        } while(fileContinue1 || fileContinue2);

    }
    else
    {
        std::cout << "ERROR!" << std::endl;

        if(!fileStream1)
        {
            std::cout << "Unable to read from file: " << file1 << std::endl;
        }
        if(!fileStream2)
        {
            std::cout << "Unable to read from file: " << file2 << std::endl;
        }
        if(!outFileStream)
        {
            std::cout << "Unable to write to file: " << OUT_FILE_NAME << std::endl;
        }
    }

    fileStream1.close();
    fileStream2.close();
    outFileStream.close();


}